

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_nim_has_valid_dims(nifti_image *nim,int complain)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = nim->dim[0];
  if (uVar5 - 8 < 0xfffffff9) {
    if (complain != 0) {
      fprintf(_stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",(ulong)uVar5);
      return 0;
    }
LAB_0011028d:
    uVar5 = 0;
  }
  else {
    uVar1 = 0;
    if (nim->ndim == uVar5) {
LAB_00110173:
      if ((nim->dim[1] != nim->nx) ||
         ((uVar5 != 1 &&
          ((nim->dim[2] != nim->ny ||
           ((2 < uVar5 &&
            ((nim->dim[3] != nim->nz ||
             ((uVar5 != 3 &&
              ((nim->dim[4] != nim->nt ||
               ((4 < uVar5 &&
                ((nim->dim[5] != nim->nu ||
                 ((uVar5 != 5 &&
                  ((nim->dim[6] != nim->nv || ((6 < uVar5 && (nim->dim[7] != nim->nw))))))))))))))))
            )))))))) {
        if (complain == 0) goto LAB_0011028d;
        uVar1 = uVar1 + 1;
        fprintf(_stderr,
                "** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n"
                ,(ulong)(uint)nim->dim[1],(ulong)(uint)nim->dim[2],(ulong)(uint)nim->dim[3],
                (ulong)(uint)nim->dim[4],(ulong)(uint)nim->dim[5],(ulong)(uint)nim->dim[6],
                (ulong)(uint)nim->dim[7],(ulong)(uint)nim->nx,(ulong)(uint)nim->ny,
                (ulong)(uint)nim->nz,(ulong)(uint)nim->nt,(ulong)(uint)nim->nu,(ulong)(uint)nim->nv,
                (ulong)(uint)nim->nw);
      }
    }
    else {
      if (complain == 0) goto LAB_0011028d;
      fprintf(_stderr,"** NVd: ndim != dim[0] (%d,%d)\n");
      uVar5 = nim->dim[0];
      uVar1 = 1;
      if (0 < (int)uVar5) goto LAB_00110173;
    }
    if (2 < g_opts_0) {
      fprintf(_stderr,"-d check dim[%d] =",(ulong)(uint)nim->dim[0]);
      for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
        fprintf(_stderr," %d",(ulong)(uint)nim->dim[lVar3]);
      }
      fputc(10,_stderr);
    }
    piVar4 = nim->dim;
    uVar2 = 1;
    uVar6 = uVar2;
    while( true ) {
      piVar4 = piVar4 + 1;
      if ((long)nim->dim[0] < (long)uVar2) break;
      if ((long)*piVar4 < 1) {
        if (complain == 0) goto LAB_0011028d;
        fprintf(_stderr,"** NVd: dim[%d] (=%d) <= 0\n",uVar2 & 0xffffffff);
        uVar1 = uVar1 + 1;
      }
      else {
        uVar6 = uVar6 * (long)*piVar4;
      }
      uVar2 = uVar2 + 1;
    }
    if (uVar6 != nim->nvox) {
      if (complain == 0) goto LAB_0011028d;
      fprintf(_stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",(long)nim->dim[0],
              nim->nvox,uVar6 & 0xffffffff);
      uVar1 = uVar1 + 1;
    }
    if (1 < g_opts_0) {
      uVar5 = nim->dim[0];
      for (lVar3 = (long)(int)uVar5; uVar5 = uVar5 + 1, lVar3 < 7; lVar3 = lVar3 + 1) {
        if (1 < (uint)nim->dim[lVar3 + 1]) {
          fprintf(_stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",(ulong)uVar5,
                  (ulong)(uint)nim->dim[lVar3 + 1],(ulong)(uint)nim->dim[0]);
        }
      }
      if (2 < g_opts_0) {
        fprintf(_stderr,"-d nim_has_valid_dims check, errs = %d\n",(ulong)uVar1);
      }
    }
    uVar5 = (uint)((int)uVar1 < 1);
  }
  return uVar5;
}

Assistant:

int nifti_nim_has_valid_dims(nifti_image * nim, int complain)
{
   size_t prod;
   int    c, errs = 0;

   /**- start with dim[0]: failure here is considered terminal */
   if( nim->dim[0] <= 0 || nim->dim[0] > 7 ){
      errs++;
      if( complain )
         fprintf(stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",nim->dim[0]);
      return 0;
   }

   /**- check whether ndim equals dim[0] */
   if( nim->ndim != nim->dim[0] ){
      errs++;
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: ndim != dim[0] (%d,%d)\n",nim->ndim,nim->dim[0]);
   }

   /**- compare each dim[i] to the proper nx, ny, ... */
   if( ( (nim->dim[0] >= 1) && (nim->dim[1] != nim->nx) ) ||
       ( (nim->dim[0] >= 2) && (nim->dim[2] != nim->ny) ) ||
       ( (nim->dim[0] >= 3) && (nim->dim[3] != nim->nz) ) ||
       ( (nim->dim[0] >= 4) && (nim->dim[4] != nim->nt) ) ||
       ( (nim->dim[0] >= 5) && (nim->dim[5] != nim->nu) ) ||
       ( (nim->dim[0] >= 6) && (nim->dim[6] != nim->nv) ) ||
       ( (nim->dim[0] >= 7) && (nim->dim[7] != nim->nw) )   ){
      errs++;
      if( !complain ) return 0;
      fprintf(stderr,"** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n"
                     "                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n",
                     nim->dim[1], nim->dim[2], nim->dim[3],
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7],
                     nim->nx, nim->ny, nim->nz,
                     nim->nt, nim->nu, nim->nv, nim->nw );
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d check dim[%d] =", nim->dim[0]);
      for( c = 0; c < 7; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /**- check the dimensions, and that their product matches nvox */
   prod = 1;
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( nim->dim[c] > 0)
         prod *= nim->dim[c];
      else if( nim->dim[c] <= 0 ){
         if( !complain ) return 0;
         fprintf(stderr,"** NVd: dim[%d] (=%d) <= 0\n",c, nim->dim[c]);
         errs++;
      }
   }
   if( prod != nim->nvox ){
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",
              nim->dim[0], (unsigned)nim->nvox, (unsigned)prod);
      errs++;
   }

   /**- if debug, warn about any remaining dim that is neither 0, nor 1 */
   /*   (values in dims above dim[0] are undefined, as reminded by Cinly
         Ooi and Alle Meije Wink)                   16 Nov 2005 [rickr] */
   if( g_opts.debug > 1 )
      for( c = nim->dim[0]+1; c <= 7; c++ )
         if( nim->dim[c] != 0 && nim->dim[c] != 1 )
            fprintf(stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",
                    c, nim->dim[c], nim->dim[0]);

   if( g_opts.debug > 2 )
      fprintf(stderr,"-d nim_has_valid_dims check, errs = %d\n", errs);

   /**- return invalid or valid */
   if( errs > 0 ) return 0;
   else           return 1;
}